

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

void entityDeclDebug(void *ctx,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                    xmlChar *content)

{
  xmllintState *lint;
  
  *(int *)((long)ctx + 0x24) = *(int *)((long)ctx + 0x24) + 1;
  if (*(int *)((long)ctx + 0x34) != 0) {
    return;
  }
  if (content == (xmlChar *)0x0) {
    content = (xmlChar *)"(null)";
  }
  if (systemId == (xmlChar *)0x0) {
    systemId = (xmlChar *)"(null)";
  }
  if (publicId == (xmlChar *)0x0) {
    publicId = (xmlChar *)"(null)";
  }
  fprintf(_stdout,"SAX.entityDecl(%s, %d, %s, %s, %s)\n",name,type,publicId,systemId,content);
  return;
}

Assistant:

static void
entityDeclDebug(void *ctx, const xmlChar *name, int type,
          const xmlChar *publicId, const xmlChar *systemId, xmlChar *content)
{
    xmllintState *lint = ctx;
    const xmlChar *nullstr = BAD_CAST "(null)";

    /* not all libraries handle printing null pointers nicely */
    if (publicId == NULL)
        publicId = nullstr;
    if (systemId == NULL)
        systemId = nullstr;
    if (content == NULL)
        content = (xmlChar *)nullstr;
    lint->callbacks++;
    if (lint->noout)
	return;
    fprintf(stdout, "SAX.entityDecl(%s, %d, %s, %s, %s)\n",
            name, type, publicId, systemId, content);
}